

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setLeaveBounds(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  DataKey *pDVar4;
  SPxId base_id;
  int i;
  int in_stack_000000e0;
  int in_stack_000000e4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000000e8;
  int in_stack_00000208;
  int in_stack_0000020c;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000210;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  SPxColId local_24;
  SPxRowId local_1c;
  DataKey local_14;
  int local_c;
  
  local_c = 0;
  while( true ) {
    iVar1 = local_c;
    iVar3 = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x2fe47d);
    if (iVar3 <= iVar1) break;
    pDVar4 = &SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc)->super_DataKey;
    local_14 = *pDVar4;
    bVar2 = SPxId::isSPxRowId((SPxId *)&local_14);
    if (bVar2) {
      SPxRowId::SPxRowId(&local_1c,(SPxId *)&local_14);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (SPxRowId *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      setLeaveBound4Row(in_stack_00000210,in_stack_0000020c,in_stack_00000208);
    }
    else {
      in_stack_ffffffffffffffc4 = local_c;
      SPxColId::SPxColId(&local_24,(SPxId *)&local_14);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (SPxColId *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      setLeaveBound4Col(in_stack_000000e8,in_stack_000000e4,in_stack_000000e0);
    }
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setLeaveBounds()
{

   for(int i = 0; i < dim(); ++i)
   {
      SPxId base_id = this->baseId(i);

      if(base_id.isSPxRowId())
         setLeaveBound4Row(i, this->number(SPxRowId(base_id)));
      else
         setLeaveBound4Col(i, this->number(SPxColId(base_id)));
   }
}